

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  
  uVar1 = (((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar10 = (ulong)uVar2;
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar12 = (long)(int)uVar2 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar9;
    }
  }
  if (uVar2 != 0) {
    pdVar9 = (this->dx_).ptr_to_data;
    pFVar5 = (fadexpr->fadexpr_).left_;
    pFVar6 = (pFVar5->fadexpr_).right_;
    iVar3 = (pFVar6->dx_).num_elts;
    if ((iVar3 == 0) || ((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        pFVar7 = (fadexpr->fadexpr_).right_;
        pFVar8 = (pFVar7->fadexpr_).right_;
        iVar4 = (pFVar8->dx_).num_elts;
        lVar13 = 0;
        do {
          pdVar14 = (double *)((long)(pFVar6->dx_).ptr_to_data + lVar13);
          if (iVar3 == 0) {
            pdVar14 = &pFVar6->defaultVal;
          }
          pdVar11 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar13);
          if (iVar4 == 0) {
            pdVar11 = &pFVar8->defaultVal;
          }
          *(double *)((long)pdVar9 + lVar13) =
               *pdVar11 * (pFVar7->fadexpr_).left_.constant_ +
               *pdVar14 * (pFVar5->fadexpr_).left_.constant_;
          lVar13 = lVar13 + 8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar14 = (pFVar6->dx_).ptr_to_data;
      pFVar7 = (fadexpr->fadexpr_).right_;
      pdVar11 = (((pFVar7->fadexpr_).right_)->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar9[uVar12] =
             pdVar11[uVar12] * (pFVar7->fadexpr_).left_.constant_ +
             pdVar14[uVar12] * (pFVar5->fadexpr_).left_.constant_;
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
  }
  pFVar5 = (fadexpr->fadexpr_).left_;
  pFVar7 = (fadexpr->fadexpr_).right_;
  this->val_ = (pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_ +
               (pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}